

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_aea87::AssertionEmitter::emitFunction(AssertionEmitter *this,Ref func)

{
  ostream *poVar1;
  undefined1 local_40 [8];
  JSPrinter jser;
  
  local_40[0] = true;
  local_40[1] = true;
  jser.pretty = false;
  jser.finalize = false;
  jser._2_6_ = 0;
  jser.buffer._0_5_ = 0;
  jser.buffer._5_3_ = 0;
  jser.size._0_5_ = 0;
  jser._21_8_ = 0;
  jser._32_8_ = func.inst;
  cashew::JSPrinter::printAst((JSPrinter *)local_40);
  poVar1 = std::operator<<((ostream *)(this->out + 0x200),(char *)jser._0_8_);
  std::endl<char,std::char_traits<char>>(poVar1);
  free((void *)jser._0_8_);
  return;
}

Assistant:

void emitFunction(Ref func) {
    JSPrinter jser(true, true, func);
    jser.printAst();
    out << jser.buffer << std::endl;
  }